

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<capnp::_::RawSchema_*>::dispose(ArrayBuilder<capnp::_::RawSchema_*> *this)

{
  RawSchema **ppRVar1;
  RemoveConst<capnp::_::RawSchema_*> *ppRVar2;
  RawSchema **ppRVar3;
  
  ppRVar1 = this->ptr;
  if (ppRVar1 != (RawSchema **)0x0) {
    ppRVar2 = this->pos;
    ppRVar3 = this->endPtr;
    this->endPtr = (RawSchema **)0x0;
    this->ptr = (RawSchema **)0x0;
    this->pos = (RemoveConst<capnp::_::RawSchema_*> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,ppRVar1,8,(long)ppRVar2 - (long)ppRVar1 >> 3,
               (long)ppRVar3 - (long)ppRVar1 >> 3,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }